

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.hpp
# Opt level: O2

void initialize_worker_for_sim<PredictionData<float,long>>
               (WorkerForSimilarity *workspace,PredictionData<float,_long> *prediction_data,
               IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,size_t n_from,
               bool assume_full_distr)

{
  ulong uVar1;
  pointer puVar2;
  ulong uVar3;
  pointer pdVar4;
  pointer puVar5;
  pointer pdVar6;
  unsigned_long uVar7;
  size_type sVar8;
  ulong uVar9;
  vector<double,_std::allocator<double>_> *this;
  value_type_conflict local_30;
  
  workspace->st = 0;
  sVar8 = prediction_data->nrows;
  workspace->end = sVar8 - 1;
  workspace->n_from = n_from;
  workspace->assume_full_distr = assume_full_distr;
  if ((workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&workspace->ix_arr,sVar8);
    puVar2 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar7 = 0;
    for (puVar5 = (workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start; puVar5 != puVar2; puVar5 = puVar5 + 1) {
      *puVar5 = uVar7;
      uVar7 = uVar7 + 1;
    }
    uVar3 = prediction_data->nrows;
    if (n_from == 0) {
      this = &workspace->tmat_sep;
      if ((uVar3 & 1) == 0) {
        uVar9 = uVar3 - 1;
        uVar1 = uVar3;
      }
      else {
        uVar1 = uVar3 - 1;
        uVar9 = uVar3;
      }
      sVar8 = uVar9 * (uVar1 >> 1);
    }
    else {
      this = &workspace->rmat;
      sVar8 = (uVar3 - n_from) * n_from;
    }
    local_30 = 0.0;
    std::vector<double,_std::allocator<double>_>::resize(this,sVar8,&local_30);
  }
  if ((model_outputs != (IsoForest *)0x0) &&
     ((model_outputs->missing_action == Divide ||
      (((model_outputs->new_cat_action == Weighted && (model_outputs->cat_split_type == SubSet)) &&
       (prediction_data->categ_data != (int *)0x0)))))) {
    pdVar6 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar6 == pdVar4) {
      local_30 = 1.0;
      std::vector<double,_std::allocator<double>_>::resize
                (&workspace->weights_arr,prediction_data->nrows,&local_30);
    }
    else {
      for (; pdVar6 != pdVar4; pdVar6 = pdVar6 + 1) {
        *pdVar6 = 1.0;
      }
    }
  }
  if (model_outputs_ext != (ExtIsoForest *)0x0) {
    pdVar6 = (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar6 == pdVar4) {
      local_30 = 0.0;
      std::vector<double,_std::allocator<double>_>::resize
                (&workspace->comb_val,prediction_data->nrows,&local_30);
    }
    else {
      for (; pdVar6 != pdVar4; pdVar6 = pdVar6 + 1) {
        *pdVar6 = 0.0;
      }
    }
  }
  return;
}

Assistant:

void initialize_worker_for_sim(WorkerForSimilarity  &workspace,
                               PredictionData       &prediction_data,
                               IsoForest            *model_outputs,
                               ExtIsoForest         *model_outputs_ext,
                               size_t                n_from,
                               bool                  assume_full_distr)
{
    workspace.st  = 0;
    workspace.end = prediction_data.nrows - 1;
    workspace.n_from = n_from;
    workspace.assume_full_distr = assume_full_distr; /* doesn't need to have one copy per worker */

    if (workspace.ix_arr.empty())
    {
        workspace.ix_arr.resize(prediction_data.nrows);
        std::iota(workspace.ix_arr.begin(), workspace.ix_arr.end(), (size_t)0);
        if (!n_from)
            workspace.tmat_sep.resize(calc_ncomb(prediction_data.nrows), 0);
        else
            workspace.rmat.resize((prediction_data.nrows - n_from) * n_from, 0);
    }

    if (model_outputs != NULL &&
        (model_outputs->missing_action == Divide ||
         (model_outputs->new_cat_action == Weighted && model_outputs->cat_split_type == SubSet && prediction_data.categ_data != NULL)))
    {
        if (workspace.weights_arr.empty())
            workspace.weights_arr.resize(prediction_data.nrows, 1.);
        else
            std::fill(workspace.weights_arr.begin(), workspace.weights_arr.end(), 1.);
    }

    if (model_outputs_ext != NULL)
    {
        if (workspace.comb_val.empty())
            workspace.comb_val.resize(prediction_data.nrows, 0);
        else
            std::fill(workspace.comb_val.begin(), workspace.comb_val.end(), 0);
    }
}